

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O2

hash_state *
llvm::hashing::detail::hash_state::create(hash_state *__return_storage_ptr__,char *s,uint64_t seed)

{
  uint64_t uVar1;
  ulong high;
  
  __return_storage_ptr__->h0 = 0;
  __return_storage_ptr__->h1 = seed;
  uVar1 = hash_16_bytes(seed,0xb492b66fbe98f273);
  __return_storage_ptr__->h2 = uVar1;
  __return_storage_ptr__->h3 =
       (seed ^ 0xb492b66fbe98f273) << 0xf | (seed ^ 0xb492b66fbe98f273) >> 0x31;
  __return_storage_ptr__->h4 = seed * -0x4b6d499041670d8d;
  high = seed >> 0x2f ^ seed;
  __return_storage_ptr__->h5 = high;
  uVar1 = hash_16_bytes(seed * -0x4b6d499041670d8d,high);
  __return_storage_ptr__->h6 = uVar1;
  mix(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

static hash_state create(const char *s, uint64_t seed) {
    hash_state state = {
      0, seed, hash_16_bytes(seed, k1), rotate(seed ^ k1, 49),
      seed * k1, shift_mix(seed), 0 };
    state.h6 = hash_16_bytes(state.h4, state.h5);
    state.mix(s);
    return state;
  }